

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<9U,_9U>::GoState(GoState<9U,_9U> *this,char (*board) [10])

{
  long in_RSI;
  long *in_RDI;
  int j;
  int i;
  GoState<9U,_9U> state;
  uint local_bc;
  uint local_b8;
  GoState<9U,_9U> *in_stack_ffffffffffffff80;
  
  *in_RDI = (long)&PTR__GoState_001f0858;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1b5627);
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 1;
  GoState(in_stack_ffffffffffffff80);
  for (local_b8 = 0; local_b8 < 9; local_b8 = local_b8 + 1) {
    for (local_bc = 0; local_bc < 9; local_bc = local_bc + 1) {
      if (*(char *)(in_RSI + (long)(int)local_b8 * 10 + (long)(int)local_bc) == '1') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_b8,local_bc,1);
      }
      else if (*(char *)(in_RSI + (long)(int)local_b8 * 10 + (long)(int)local_bc) == '2') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_b8,local_bc,2);
      }
      else {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_b8,local_bc,0);
      }
    }
  }
  ~GoState((GoState<9U,_9U> *)0x1b5773);
  return;
}

Assistant:

GoState(char board[M][N+1]):
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{
		GoState<M, N> state;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == '1') {
				set_pos(i, j, 1);
			}
			else if (board[i][j] == '2') {
				set_pos(i, j, 2);
			}
			else {
				set_pos(i, j, empty);
			}
		}}
	}